

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

Text __thiscall loguru::stacktrace(loguru *this,int skip)

{
  char *pcVar1;
  int in_EDX;
  string str;
  string local_30;
  
  stacktrace_as_stdstring_abi_cxx11_(&local_30,(loguru *)(ulong)(skip + 1),in_EDX);
  pcVar1 = strdup(local_30._M_dataplus._M_p);
  *(char **)this = pcVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return (Text)(char *)this;
}

Assistant:

Text stacktrace(int skip)
	{
		auto str = stacktrace_as_stdstring(skip + 1);
		return Text(STRDUP(str.c_str()));
	}